

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light_pcapng.c
# Opt level: O3

uint32_t * light_pcapng_to_memory(light_pcapng pcapng,size_t *size)

{
  uint32_t *puVar1;
  uint uVar2;
  size_t __n;
  light_pcapng iterator;
  _light_pcapng *p_Var3;
  uint32_t *puVar4;
  uint32_t *__src;
  uint uVar5;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  size_t size_1;
  size_t __nmemb;
  size_t option_length;
  size_t local_38;
  
  if (pcapng == (light_pcapng)0x0) {
    *size = 0;
  }
  else {
    __nmemb = 0;
    p_Var3 = pcapng;
    do {
      __nmemb = __nmemb + p_Var3->block_total_lenght;
      p_Var3 = p_Var3->next_block;
    } while (p_Var3 != (_light_pcapng *)0x0);
    puVar4 = (uint32_t *)calloc(__nmemb,1);
    if (puVar4 != (uint32_t *)0x0) {
      *size = 0;
      puVar1 = puVar4;
      while( true ) {
        if (__nmemb == 0) {
          return puVar4;
        }
        lVar6 = (ulong)pcapng->block_total_lenght - 0xc;
        __src = __get_option_size(pcapng->options,&local_38);
        __n = local_38;
        uVar8 = lVar6 - local_38;
        *puVar1 = pcapng->block_type;
        puVar1[1] = pcapng->block_total_lenght;
        memcpy(puVar1 + 2,pcapng->block_body,uVar8);
        memcpy((void *)((long)puVar1 + (uVar8 & 0xfffffffffffffffc) + 8),__src,__n);
        uVar2 = pcapng->block_total_lenght;
        uVar8 = (ulong)uVar2;
        uVar7 = uVar2 >> 2;
        puVar1[uVar7 - 1] = uVar2;
        uVar5 = (int)lVar6 + 0xc;
        if (uVar2 != uVar5) {
          fprintf(_stderr,"ERROR at %s::%s::%d: %d != %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/rvelea[P]LightPcapNg/src/light_pcapng.c"
                  ,"light_pcapng_to_memory",0x169,uVar8,uVar5);
          uVar8 = (ulong)pcapng->block_total_lenght;
          uVar7 = pcapng->block_total_lenght >> 2;
        }
        *size = *size + uVar8;
        free(__src);
        pcapng = pcapng->next_block;
        if (pcapng == (_light_pcapng *)0x0) break;
        puVar1 = puVar1 + uVar7;
        __nmemb = __nmemb - uVar8;
      }
      return puVar4;
    }
    light_pcapng_to_memory_cold_1();
  }
  return (uint32_t *)0x0;
}

Assistant:

uint32_t *light_pcapng_to_memory(const light_pcapng pcapng, size_t *size)
{
	if (pcapng == NULL) {
		*size = 0;
		return NULL;
	}

	light_pcapng iterator = pcapng;
	size_t bytes = light_get_size(pcapng);
	uint32_t *block_mem = calloc(bytes, 1);
	uint32_t *block_offset = block_mem;
	DCHECK_NULLP(block_offset, return NULL);

	*size = 0;
	while (iterator != NULL && bytes > 0) {
		size_t body_length = iterator->block_total_lenght - 2 * sizeof(iterator->block_total_lenght) - sizeof(iterator->block_type);
		size_t option_length;
		uint32_t *option_mem = __get_option_size(iterator->options, &option_length);
		body_length -= option_length;

		block_offset[0] = iterator->block_type;
		block_offset[1] = iterator->block_total_lenght;
		memcpy(&block_offset[2], iterator->block_body, body_length);
		memcpy(&block_offset[2 + body_length / 4], option_mem, option_length);
		block_offset[iterator->block_total_lenght / 4 - 1] = iterator->block_total_lenght;

		DCHECK_ASSERT(iterator->block_total_lenght, body_length + option_length + 3 * sizeof(uint32_t), light_stop);
		block_offset += iterator->block_total_lenght / 4;
		bytes -= iterator->block_total_lenght;
		*size += iterator->block_total_lenght;

		free(option_mem);
		iterator = iterator->next_block;
	}

	return block_mem;
}